

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::CommissionerApp::GetRegistrarHostname
          (Error *__return_storage_ptr__,CommissionerApp *this,string *aHostname)

{
  char cVar1;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a0;
  undefined1 local_80 [40];
  format_string_checker<char> local_58;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if (((this->mBbrDataset).mPresentFlags & 0x4000) == 0) {
    local_58.types_[0] = none_type;
    local_58.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find valid Registrar Hostname in BBR Dataset";
    local_58.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x33;
    local_58.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_58.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_58.parse_funcs_[0] = (parse_func)0x0;
    from = "cannot find valid Registrar Hostname in BBR Dataset";
    write.handler_ = &local_58;
    local_58.context_.types_ = local_58.types_;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_0014c9a1;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",&local_58);
    }
LAB_0014c9a1:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a0,(v10 *)"cannot find valid Registrar Hostname in BBR Dataset",
               (string_view)ZEXT816(0x33),args);
    local_80._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_a0);
    Error::operator=(__return_storage_ptr__,(Error *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    std::__cxx11::string::_M_assign((string *)aHostname);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetRegistrarHostname(std::string &aHostname) const
{
    Error error;

    VerifyOrExit(mBbrDataset.mPresentFlags & BbrDataset::kRegistrarHostnameBit,
                 error = ERROR_NOT_FOUND("cannot find valid Registrar Hostname in BBR Dataset"));
    aHostname = mBbrDataset.mRegistrarHostname;

exit:
    return error;
}